

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZBFileStream.cpp
# Opt level: O0

void __thiscall
TPZBFileStream::ReadData<TFad<10,double>>(TPZBFileStream *this,TFad<10,_double> *p,int howMany)

{
  long in_RSI;
  long in_RDI;
  
  std::istream::read((char *)(in_RDI + 8),in_RSI);
  return;
}

Assistant:

void TPZBFileStream::ReadData(T *p, int howMany) {
    fIn.read(reinterpret_cast<char *>(p), howMany * sizeof(T));
#ifdef PZDEBUG
    if (fIn.bad()) {
        PZError << "TBFileStream:Could not read from stream" << std::endl;
        DebugStop();
    }
#endif
}